

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtriangulator.cpp
# Opt level: O3

bool __thiscall
QTriangulator<unsigned_int>::SimpleToMonotone::pointIsInSector
          (SimpleToMonotone *this,QPodPoint *p,QPodPoint *v1,QPodPoint *v2,QPodPoint *v3)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  
  iVar1 = v2->x;
  iVar2 = v2->y;
  lVar7 = (long)v1->x - (long)iVar1;
  lVar10 = (long)v1->y - (long)iVar2;
  lVar6 = (p->y - iVar2) * lVar7;
  lVar8 = (p->x - iVar1) * lVar10;
  iVar3 = v3->x;
  iVar4 = v3->y;
  lVar9 = (long)(p->y - iVar4) * (long)(iVar1 - iVar3);
  lVar11 = (long)(p->x - iVar3) * (long)(iVar2 - iVar4);
  if ((iVar3 - iVar1) * lVar10 < (iVar4 - iVar2) * lVar7) {
    bVar5 = lVar8 <= lVar6 && lVar11 <= lVar9;
  }
  else {
    bVar5 = lVar8 <= lVar6 || lVar11 <= lVar9;
  }
  return bVar5;
}

Assistant:

bool QTriangulator<T>::SimpleToMonotone::pointIsInSector(const QPodPoint &p, const QPodPoint &v1, const QPodPoint &v2, const QPodPoint &v3)
{
    bool leftOfPreviousEdge = !qPointIsLeftOfLine(p, v2, v1);
    bool leftOfNextEdge = !qPointIsLeftOfLine(p, v3, v2);

    if (qPointIsLeftOfLine(v1, v2, v3))
        return leftOfPreviousEdge && leftOfNextEdge;
    else
        return leftOfPreviousEdge || leftOfNextEdge;
}